

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_ptr_field.h
# Opt level: O3

void __thiscall
google::protobuf::internal::RepeatedPtrFieldBase::
AddCleared<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
          (RepeatedPtrFieldBase *this,Type *value)

{
  LogMessage *pLVar1;
  Rep *pRVar2;
  int iVar3;
  LogFinisher local_51;
  LogMessage local_50;
  
  if (this->arena_ != (Arena *)0x0) {
    LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/repeated_ptr_field.h"
               ,0x4b5);
    pLVar1 = LogMessage::operator<<(&local_50,"CHECK failed: GetArena() == nullptr: ");
    pLVar1 = LogMessage::operator<<
                       (pLVar1,
                        "AddCleared() can only be used on a RepeatedPtrField not on an arena.");
    LogFinisher::operator=(&local_51,pLVar1);
    LogMessage::~LogMessage(&local_50);
  }
  pRVar2 = this->rep_;
  if (pRVar2 == (Rep *)0x0) {
    iVar3 = this->total_size_;
  }
  else {
    iVar3 = pRVar2->allocated_size;
    if (iVar3 != this->total_size_) goto LAB_00377dbb;
  }
  Reserve(this,iVar3 + 1);
  pRVar2 = this->rep_;
  iVar3 = pRVar2->allocated_size;
LAB_00377dbb:
  pRVar2->allocated_size = iVar3 + 1;
  pRVar2->elements[iVar3] = value;
  return;
}

Assistant:

inline void RepeatedPtrFieldBase::AddCleared(
    typename TypeHandler::Type* value) {
  GOOGLE_DCHECK(GetArena() == nullptr)
      << "AddCleared() can only be used on a RepeatedPtrField not on an arena.";
  GOOGLE_DCHECK(TypeHandler::GetOwningArena(value) == nullptr)
      << "AddCleared() can only accept values not on an arena.";
  if (!rep_ || rep_->allocated_size == total_size_) {
    Reserve(total_size_ + 1);
  }
  rep_->elements[rep_->allocated_size++] = value;
}